

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O2

void __thiscall
SourceMapTest_OptionalFields_Test::~SourceMapTest_OptionalFields_Test
          (SourceMapTest_OptionalFields_Test *this)

{
  SourceMapTest::~SourceMapTest(&this->super_SourceMapTest);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SourceMapTest, OptionalFields) {
  // The "names" field is optional.
  std::string sourceMap = R"(
    {
      "version": 3,
      "sources": [],
      "mappings": "A"
    }
  )";
  parseMap(sourceMap);
}